

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientKeepAlive.cpp
# Opt level: O3

void __thiscall
ki::protocol::control::ClientKeepAlive::read_from(ClientKeepAlive *this,istream *istream)

{
  Field<unsigned_short> *pFVar1;
  Field<unsigned_short> *pFVar2;
  Field<unsigned_short> *pFVar3;
  Record record;
  ostringstream oss;
  string local_278;
  string local_258;
  string local_238 [2];
  Record local_1f8 [5];
  
  ki::dml::Record::Record(local_1f8);
  local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"m_session_id","");
  pFVar1 = ki::dml::Record::add_field<unsigned_short>(local_1f8,local_238,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
    operator_delete(local_238[0]._M_dataplus._M_p);
  }
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"m_milliseconds","");
  pFVar2 = ki::dml::Record::add_field<unsigned_short>(local_1f8,&local_258,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"m_minutes","");
  pFVar3 = ki::dml::Record::add_field<unsigned_short>(local_1f8,&local_278,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  ki::dml::Record::read_from(local_1f8,istream);
  this->m_session_id = pFVar1->m_value;
  this->m_milliseconds = pFVar2->m_value;
  this->m_minutes = pFVar3->m_value;
  ki::dml::Record::~Record(local_1f8);
  return;
}

Assistant:

void ClientKeepAlive::read_from(std::istream &istream)
	{
		dml::Record record;
		auto *session_id = record.add_field<dml::USHRT>("m_session_id");
		auto *milliseconds = record.add_field<dml::USHRT>("m_milliseconds");
		auto *minutes = record.add_field<dml::USHRT>("m_minutes");
		try
		{
			record.read_from(istream);
		}
		catch (dml::parse_error &e)
		{
			std::ostringstream oss;
			oss << "Error reading ClientKeepAlive payload: " << e.what();
			throw parse_error(oss.str(), parse_error::INVALID_MESSAGE_DATA);
		}

		m_session_id = session_id->get_value();
		m_milliseconds = milliseconds->get_value();
		m_minutes = minutes->get_value();
	}